

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

RPCHelpMan * estimatesmartfee(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff2d8;
  allocator<RPCResult> *paVar1;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff310;
  allocator<char> *in_stack_fffffffffffff318;
  UniValue *in_stack_fffffffffffff320;
  undefined7 in_stack_fffffffffffff328;
  undefined1 in_stack_fffffffffffff32f;
  string *in_stack_fffffffffffff330;
  undefined7 in_stack_fffffffffffff338;
  undefined1 in_stack_fffffffffffff33f;
  undefined4 in_stack_fffffffffffff340;
  Type in_stack_fffffffffffff344;
  string *in_stack_fffffffffffff348;
  undefined4 in_stack_fffffffffffff350;
  Type in_stack_fffffffffffff354;
  undefined4 in_stack_fffffffffffff358;
  Type in_stack_fffffffffffff35c;
  RPCResult *in_stack_fffffffffffff360;
  undefined1 *local_c88;
  undefined1 *local_c70;
  undefined1 *local_c58;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *in_stack_fffffffffffff540;
  allocator<char> local_a9b;
  allocator<char> local_a9a [32];
  allocator<char> local_a7a;
  allocator<char> local_a79 [31];
  undefined1 local_a5a;
  undefined1 local_a59 [40];
  undefined1 local_a31 [31];
  undefined1 local_a12 [31];
  allocator<char> local_9f3;
  allocator<char> local_9f2;
  allocator<char> local_9f1 [8];
  allocator<char> local_9e9 [31];
  allocator<char> local_9ca;
  allocator<char> local_9c9 [385];
  undefined1 local_848 [136];
  undefined1 local_7c0 [160];
  undefined1 local_720 [136];
  RPCResults local_698 [11];
  undefined1 local_588 [200];
  undefined1 local_4c0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined1 local_480;
  undefined1 local_47f;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  local_9f1[1] = (allocator<char>)0x0;
  local_9f1[2] = (allocator<char>)0x0;
  local_9f1[3] = (allocator<char>)0x0;
  local_9f1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff2e8,&in_stack_fffffffffffff2e0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff2f0);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff2d8);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                 in_stack_fffffffffffff348,in_stack_fffffffffffff344,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
                 in_stack_fffffffffffff330,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  UniValue::UniValue<const_char_(&)[11],_char[11],_true>
            (in_stack_fffffffffffff320,(char (*) [11])in_stack_fffffffffffff318);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  common::FeeModesDetail((string *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328));
  std::operator+((char *)in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
  local_4c0 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff2f0);
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff2d8);
  local_480 = 0;
  local_47f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
                 in_stack_fffffffffffff348,in_stack_fffffffffffff344,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
                 in_stack_fffffffffffff330,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328));
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff2d8);
  __l._M_len._0_7_ = in_stack_fffffffffffff328;
  __l._M_array = (iterator)in_stack_fffffffffffff320;
  __l._M_len._7_1_ = in_stack_fffffffffffff32f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff318,__l,
             (allocator_type *)in_stack_fffffffffffff310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  this_00 = (RPCHelpMan *)local_a12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  name = (string *)local_a31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff320);
  std::operator+(in_stack_fffffffffffff2f0,(char *)in_stack_fffffffffffff2e8);
  local_a59._1_8_ = 0;
  local_a59._9_8_ = 0;
  local_a59._17_8_ = 0;
  description = (string *)(local_a59 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff2d8);
  paVar1 = (allocator<RPCResult> *)((ulong)in_stack_fffffffffffff2d8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
             in_stack_fffffffffffff354,in_stack_fffffffffffff348,
             SUB41(in_stack_fffffffffffff344 >> 0x18,0),
             (string *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff330,
             (bool)in_stack_fffffffffffff32f);
  results = local_698;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_a59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  examples = (RPCExamples *)&local_a5a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  local_a9a[2] = (allocator<char>)0x0;
  local_a9a[3] = (allocator<char>)0x0;
  local_a9a[4] = (allocator<char>)0x0;
  local_a9a[5] = (allocator<char>)0x0;
  local_a9a[6] = (allocator<char>)0x0;
  local_a9a[7] = (allocator<char>)0x0;
  local_a9a[8] = (allocator<char>)0x0;
  local_a9a[9] = (allocator<char>)0x0;
  local_a9a[10] = (allocator<char>)0x0;
  local_a9a[0xb] = (allocator<char>)0x0;
  local_a9a[0xc] = (allocator<char>)0x0;
  local_a9a[0xd] = (allocator<char>)0x0;
  local_a9a[0xe] = (allocator<char>)0x0;
  local_a9a[0xf] = (allocator<char>)0x0;
  local_a9a[0x10] = (allocator<char>)0x0;
  local_a9a[0x11] = (allocator<char>)0x0;
  local_a9a[0x12] = (allocator<char>)0x0;
  local_a9a[0x13] = (allocator<char>)0x0;
  local_a9a[0x14] = (allocator<char>)0x0;
  local_a9a[0x15] = (allocator<char>)0x0;
  local_a9a[0x16] = (allocator<char>)0x0;
  local_a9a[0x17] = (allocator<char>)0x0;
  local_a9a[0x18] = (allocator<char>)0x0;
  local_a9a[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            (in_stack_fffffffffffff360,in_stack_fffffffffffff35c,
             (string *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
             in_stack_fffffffffffff348,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
             (bool)in_stack_fffffffffffff33f);
  std::allocator<RPCResult>::allocator(paVar1);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff328;
  __l_00._M_array = (iterator)in_stack_fffffffffffff320;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff32f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff318,__l_00,
             (allocator_type *)in_stack_fffffffffffff310);
  paVar1 = (allocator<RPCResult> *)((ulong)paVar1 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
             in_stack_fffffffffffff354,in_stack_fffffffffffff348,
             SUB41(in_stack_fffffffffffff344 >> 0x18,0),
             (string *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff330,
             (bool)in_stack_fffffffffffff32f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar1);
  RPCResult::RPCResult
            (in_stack_fffffffffffff360,in_stack_fffffffffffff35c,
             (string *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
             in_stack_fffffffffffff348,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
             (bool)in_stack_fffffffffffff33f);
  std::allocator<RPCResult>::allocator(paVar1);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff328;
  __l_01._M_array = (iterator)in_stack_fffffffffffff320;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff32f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff318,__l_01,
             (allocator_type *)in_stack_fffffffffffff310);
  RPCResult::RPCResult
            (in_stack_fffffffffffff360,in_stack_fffffffffffff35c,
             (string *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350),
             in_stack_fffffffffffff348,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
             (bool)in_stack_fffffffffffff33f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff35c,in_stack_fffffffffffff358),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff354,in_stack_fffffffffffff350));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  HelpExampleCli(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (char *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  HelpExampleRpc(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  std::operator+(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  RPCExamples::RPCExamples((RPCExamples *)paVar1,(string *)0x5d289e);
  this = (RPCArg *)&stack0xfffffffffffff520;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<estimatesmartfee()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff2e8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff2e0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,in_stack_fffffffffffff540);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff543);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff544);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff545);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff546);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff2e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_c58 = local_588;
  do {
    local_c58 = local_c58 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_c58 != local_720);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff2e8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a9b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a9a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff2e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_c70 = local_7c0;
  do {
    local_c70 = local_c70 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_c70 != local_848);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff2e8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_a7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_a79);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_a5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_a59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff2e8);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_a31);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_a12);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_a12 + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff2e8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_c88 = local_48;
  do {
    local_c88 = local_c88 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_c88 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9f3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9f2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9e9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9c9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan estimatesmartfee()
{
    return RPCHelpMan{"estimatesmartfee",
        "\nEstimates the approximate fee per kilobyte needed for a transaction to begin\n"
        "confirmation within conf_target blocks if possible and return the number of blocks\n"
        "for which the estimate is valid. Uses virtual transaction size as defined\n"
        "in BIP 141 (witness data is discounted).\n",
        {
            {"conf_target", RPCArg::Type::NUM, RPCArg::Optional::NO, "Confirmation target in blocks (1 - 1008)"},
            {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"economical"}, "The fee estimate mode.\n"
              + FeeModesDetail(std::string("default mode will be used"))},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::NUM, "feerate", /*optional=*/true, "estimate fee rate in " + CURRENCY_UNIT + "/kvB (only present if no errors were encountered)"},
                {RPCResult::Type::ARR, "errors", /*optional=*/true, "Errors encountered during processing (if there are any)",
                    {
                        {RPCResult::Type::STR, "", "error"},
                    }},
                {RPCResult::Type::NUM, "blocks", "block number where estimate was found\n"
                "The request target will be clamped between 2 and the highest target\n"
                "fee estimation is able to return based on how long it has been running.\n"
                "An error is returned if not enough transactions and blocks\n"
                "have been observed to make an estimate for any number of blocks."},
        }},
        RPCExamples{
            HelpExampleCli("estimatesmartfee", "6") +
            HelpExampleRpc("estimatesmartfee", "6")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            CBlockPolicyEstimator& fee_estimator = EnsureAnyFeeEstimator(request.context);
            const NodeContext& node = EnsureAnyNodeContext(request.context);
            const CTxMemPool& mempool = EnsureMemPool(node);

            CHECK_NONFATAL(mempool.m_opts.signals)->SyncWithValidationInterfaceQueue();
            unsigned int max_target = fee_estimator.HighestTargetTracked(FeeEstimateHorizon::LONG_HALFLIFE);
            unsigned int conf_target = ParseConfirmTarget(request.params[0], max_target);
            bool conservative = false;
            if (!request.params[1].isNull()) {
                FeeEstimateMode fee_mode;
                if (!FeeModeFromString(request.params[1].get_str(), fee_mode)) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, InvalidEstimateModeErrorMessage());
                }
                if (fee_mode == FeeEstimateMode::CONSERVATIVE) conservative = true;
            }

            UniValue result(UniValue::VOBJ);
            UniValue errors(UniValue::VARR);
            FeeCalculation feeCalc;
            CFeeRate feeRate{fee_estimator.estimateSmartFee(conf_target, &feeCalc, conservative)};
            if (feeRate != CFeeRate(0)) {
                CFeeRate min_mempool_feerate{mempool.GetMinFee()};
                CFeeRate min_relay_feerate{mempool.m_opts.min_relay_feerate};
                feeRate = std::max({feeRate, min_mempool_feerate, min_relay_feerate});
                result.pushKV("feerate", ValueFromAmount(feeRate.GetFeePerK()));
            } else {
                errors.push_back("Insufficient data or no feerate found");
                result.pushKV("errors", std::move(errors));
            }
            result.pushKV("blocks", feeCalc.returnedTarget);
            return result;
        },
    };
}